

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

void __thiscall BackwardPass::ProcessNoImplicitCallDef(BackwardPass *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  BOOLEAN BVar4;
  undefined4 *puVar5;
  RegOpnd *pRVar6;
  Opnd *pOVar7;
  SymOpnd *pSVar8;
  byte local_55;
  StackSym *local_48;
  Sym *srcSym;
  Opnd *local_38;
  Opnd *src;
  bool transferArrayLengthSymUse;
  bool transferJsArrayHeadSegmentSymUse;
  bool transferNativeArrayUse;
  StackSym *pSStack_28;
  bool transferNoMissingValuesUse;
  Sym *dstSym;
  Opnd *dst;
  Instr *instr_local;
  BackwardPass *this_local;
  
  dst = (Opnd *)instr;
  instr_local = (Instr *)this;
  if (this->tag != DeadStorePhase) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1183,"(tag == Js::DeadStorePhase)","tag == Js::DeadStorePhase");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (dst == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1184,"(instr)","instr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  dstSym = (Sym *)IR::Instr::GetDst((Instr *)dst);
  if (dstSym == (Sym *)0x0) {
    return;
  }
  OVar3 = IR::Opnd::GetKind((Opnd *)dstSym);
  if (OVar3 == OpndKindSym) {
    pSVar8 = IR::Opnd::AsSymOpnd((Opnd *)dstSym);
    pSStack_28 = (StackSym *)pSVar8->m_sym;
    bVar2 = Sym::IsPropertySym((Sym *)pSStack_28);
    if (!bVar2) {
      return;
    }
  }
  else {
    if (OVar3 != OpndKindReg) {
      return;
    }
    pRVar6 = IR::Opnd::AsRegOpnd((Opnd *)dstSym);
    pSStack_28 = pRVar6->m_sym;
  }
  BVar4 = BVSparse<Memory::JitArenaAllocator>::TestAndClear
                    (this->currentBlock->noImplicitCallUses,(pSStack_28->super_Sym).m_id);
  if (BVar4 == '\0') {
    BVar4 = BVSparse<Memory::JitArenaAllocator>::Test
                      (this->currentBlock->noImplicitCallNoMissingValuesUses,
                       (pSStack_28->super_Sym).m_id);
    if (BVar4 != '\0') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x11a1,
                         "(!currentBlock->noImplicitCallNoMissingValuesUses->Test(dstSym->m_id))",
                         "!currentBlock->noImplicitCallNoMissingValuesUses->Test(dstSym->m_id)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    BVar4 = BVSparse<Memory::JitArenaAllocator>::Test
                      (this->currentBlock->noImplicitCallNativeArrayUses,
                       (pSStack_28->super_Sym).m_id);
    if (BVar4 != '\0') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x11a2,
                         "(!currentBlock->noImplicitCallNativeArrayUses->Test(dstSym->m_id))",
                         "!currentBlock->noImplicitCallNativeArrayUses->Test(dstSym->m_id)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    BVar4 = BVSparse<Memory::JitArenaAllocator>::Test
                      (this->currentBlock->noImplicitCallJsArrayHeadSegmentSymUses,
                       (pSStack_28->super_Sym).m_id);
    if (BVar4 != '\0') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x11a3,
                         "(!currentBlock->noImplicitCallJsArrayHeadSegmentSymUses->Test(dstSym->m_id))"
                         ,
                         "!currentBlock->noImplicitCallJsArrayHeadSegmentSymUses->Test(dstSym->m_id)"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    BVar4 = BVSparse<Memory::JitArenaAllocator>::Test
                      (this->currentBlock->noImplicitCallArrayLengthSymUses,
                       (pSStack_28->super_Sym).m_id);
    if (BVar4 == '\0') {
      return;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x11a4,
                       "(!currentBlock->noImplicitCallArrayLengthSymUses->Test(dstSym->m_id))",
                       "!currentBlock->noImplicitCallArrayLengthSymUses->Test(dstSym->m_id)");
    if (bVar2) {
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
      return;
    }
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  BVar4 = BVSparse<Memory::JitArenaAllocator>::TestAndClear
                    (this->currentBlock->noImplicitCallNoMissingValuesUses,
                     (pSStack_28->super_Sym).m_id);
  src._7_1_ = BVar4 != '\0';
  BVar4 = BVSparse<Memory::JitArenaAllocator>::TestAndClear
                    (this->currentBlock->noImplicitCallNativeArrayUses,(pSStack_28->super_Sym).m_id)
  ;
  src._6_1_ = BVar4 != '\0';
  BVar4 = BVSparse<Memory::JitArenaAllocator>::TestAndClear
                    (this->currentBlock->noImplicitCallJsArrayHeadSegmentSymUses,
                     (pSStack_28->super_Sym).m_id);
  src._5_1_ = BVar4 != '\0';
  BVar4 = BVSparse<Memory::JitArenaAllocator>::TestAndClear
                    (this->currentBlock->noImplicitCallArrayLengthSymUses,
                     (pSStack_28->super_Sym).m_id);
  src._4_1_ = BVar4 != '\0';
  local_38 = IR::Instr::GetSrc1((Instr *)dst);
  if (local_38 == (Opnd *)0x0) {
    return;
  }
  pOVar7 = IR::Instr::GetSrc2((Instr *)dst);
  if ((pOVar7 != (Opnd *)0x0) &&
     (bVar2 = OpCodeAttr::NonIntTransfer(*(OpCode *)&dst[3]._vptr_Opnd), !bVar2)) {
    return;
  }
  bVar2 = IR::Opnd::IsRegOpnd((Opnd *)dstSym);
  if ((bVar2) && (bVar2 = IR::Opnd::IsRegOpnd(local_38), bVar2)) {
    bVar2 = OpCodeAttr::NonIntTransfer(*(OpCode *)&dst[3]._vptr_Opnd);
    if (!bVar2) {
      return;
    }
    goto LAB_004dcda4;
  }
  bVar2 = IR::Opnd::IsRegOpnd((Opnd *)dstSym);
  if ((bVar2) && (bVar2 = IR::Opnd::IsSymOpnd(local_38), bVar2)) {
    pSVar8 = IR::Opnd::AsSymOpnd(local_38);
    bVar2 = Sym::IsPropertySym(pSVar8->m_sym);
    if (!bVar2) goto LAB_004dcd4b;
LAB_004dcd86:
    bVar2 = IR::Instr::TransfersSrcValue((Instr *)dst);
    local_55 = bVar2 ^ 0xff;
  }
  else {
LAB_004dcd4b:
    bVar2 = IR::Opnd::IsRegOpnd(local_38);
    local_55 = 1;
    if (bVar2) {
      srcSym._6_2_ = (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                     IR::Opnd::GetValueType((Opnd *)dstSym);
      bVar2 = ValueType::IsArrayOrObjectWithArray((ValueType *)((long)&srcSym + 6));
      local_55 = 1;
      if (bVar2) goto LAB_004dcd86;
    }
  }
  if ((local_55 & 1) != 0) {
    return;
  }
LAB_004dcda4:
  local_48 = (StackSym *)0x0;
  OVar3 = IR::Opnd::GetKind(local_38);
  if (OVar3 == OpndKindSym) {
    pSVar8 = IR::Opnd::AsSymOpnd(local_38);
    local_48 = (StackSym *)pSVar8->m_sym;
    bVar2 = Sym::IsPropertySym((Sym *)local_48);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x11d5,"(srcSym->IsPropertySym())","srcSym->IsPropertySym()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
  }
  else if (OVar3 == OpndKindReg) {
    pRVar6 = IR::Opnd::AsRegOpnd(local_38);
    local_48 = pRVar6->m_sym;
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x11d9,"(false)","false");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  BVSparse<Memory::JitArenaAllocator>::Set
            (this->currentBlock->noImplicitCallUses,(local_48->super_Sym).m_id);
  if ((src._7_1_ & 1) != 0) {
    BVSparse<Memory::JitArenaAllocator>::Set
              (this->currentBlock->noImplicitCallNoMissingValuesUses,(local_48->super_Sym).m_id);
  }
  if ((src._6_1_ & 1) != 0) {
    BVSparse<Memory::JitArenaAllocator>::Set
              (this->currentBlock->noImplicitCallNativeArrayUses,(local_48->super_Sym).m_id);
  }
  if ((src._5_1_ & 1) != 0) {
    BVSparse<Memory::JitArenaAllocator>::Set
              (this->currentBlock->noImplicitCallJsArrayHeadSegmentSymUses,
               (local_48->super_Sym).m_id);
  }
  if ((src._4_1_ & 1) != 0) {
    BVSparse<Memory::JitArenaAllocator>::Set
              (this->currentBlock->noImplicitCallArrayLengthSymUses,(local_48->super_Sym).m_id);
  }
  return;
}

Assistant:

void
BackwardPass::ProcessNoImplicitCallDef(IR::Instr *const instr)
{
    Assert(tag == Js::DeadStorePhase);
    Assert(instr);

    IR::Opnd *const dst = instr->GetDst();
    if(!dst)
    {
        return;
    }

    Sym *dstSym;
    switch(dst->GetKind())
    {
        case IR::OpndKindReg:
            dstSym = dst->AsRegOpnd()->m_sym;
            break;

        case IR::OpndKindSym:
            dstSym = dst->AsSymOpnd()->m_sym;
            if(!dstSym->IsPropertySym())
            {
                return;
            }
            break;

        default:
            return;
    }

    if(!currentBlock->noImplicitCallUses->TestAndClear(dstSym->m_id))
    {
        Assert(!currentBlock->noImplicitCallNoMissingValuesUses->Test(dstSym->m_id));
        Assert(!currentBlock->noImplicitCallNativeArrayUses->Test(dstSym->m_id));
        Assert(!currentBlock->noImplicitCallJsArrayHeadSegmentSymUses->Test(dstSym->m_id));
        Assert(!currentBlock->noImplicitCallArrayLengthSymUses->Test(dstSym->m_id));
        return;
    }
    const bool transferNoMissingValuesUse = !!currentBlock->noImplicitCallNoMissingValuesUses->TestAndClear(dstSym->m_id);
    const bool transferNativeArrayUse = !!currentBlock->noImplicitCallNativeArrayUses->TestAndClear(dstSym->m_id);
    const bool transferJsArrayHeadSegmentSymUse =
        !!currentBlock->noImplicitCallJsArrayHeadSegmentSymUses->TestAndClear(dstSym->m_id);
    const bool transferArrayLengthSymUse = !!currentBlock->noImplicitCallArrayLengthSymUses->TestAndClear(dstSym->m_id);

    IR::Opnd *const src = instr->GetSrc1();

    // Stop attempting to transfer noImplicitCallUses symbol if the instr is not a transfer instr (based on the opcode's 
    // flags) or does not have the attributes to be a transfer instr (based on the existance of src and src2).
    if(!src || (instr->GetSrc2() && !OpCodeAttr::NonIntTransfer(instr->m_opcode)))
    {
        return;
    }
    if(dst->IsRegOpnd() && src->IsRegOpnd())
    {
        if(!OpCodeAttr::NonIntTransfer(instr->m_opcode))
        {
            return;
        }
    }
    else if(
        !(
            // LdFld or similar
            (dst->IsRegOpnd() && src->IsSymOpnd() && src->AsSymOpnd()->m_sym->IsPropertySym()) ||

            // StFld or similar. Don't transfer a field opnd from StFld into the reg opnd src unless the field's value type is
            // definitely array or object with array, because only those value types require implicit calls to be disabled as
            // long as they are live. Other definite value types only require implicit calls to be disabled as long as a live
            // field holds the value, which is up to the StFld when going backwards.
            (src->IsRegOpnd() && dst->GetValueType().IsArrayOrObjectWithArray())
        ) ||
        !instr->TransfersSrcValue())
    {
        return;
    }

    Sym *srcSym = nullptr;
    switch(src->GetKind())
    {
        case IR::OpndKindReg:
            srcSym = src->AsRegOpnd()->m_sym;
            break;

        case IR::OpndKindSym:
            srcSym = src->AsSymOpnd()->m_sym;
            Assert(srcSym->IsPropertySym());
            break;

        default:
            Assert(false);
            __assume(false);
    }

    currentBlock->noImplicitCallUses->Set(srcSym->m_id);
    if(transferNoMissingValuesUse)
    {
        currentBlock->noImplicitCallNoMissingValuesUses->Set(srcSym->m_id);
    }
    if(transferNativeArrayUse)
    {
        currentBlock->noImplicitCallNativeArrayUses->Set(srcSym->m_id);
    }
    if(transferJsArrayHeadSegmentSymUse)
    {
        currentBlock->noImplicitCallJsArrayHeadSegmentSymUses->Set(srcSym->m_id);
    }
    if(transferArrayLengthSymUse)
    {
        currentBlock->noImplicitCallArrayLengthSymUses->Set(srcSym->m_id);
    }
}